

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpServer.cpp
# Opt level: O2

void __thiscall
sznet::net::TcpServer::removeConnectionInLoop(TcpServer *this,TcpConnectionPtr *conn)

{
  EventLoop *this_00;
  self *psVar1;
  size_type sVar2;
  SourceFile file;
  undefined1 local_1030 [4048];
  undefined1 local_60 [12];
  code *local_50;
  undefined8 local_48;
  Functor local_40;
  
  EventLoop::assertInLoopThread(this->m_loop);
  if (g_logLevel < 3) {
    Logger::SourceFile::SourceFile<100>
              ((SourceFile *)local_60,
               (char (*) [100])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/TcpServer.cpp"
              );
    file._12_4_ = 0;
    file.m_data = (char *)local_60._0_8_;
    file.m_size = local_60._8_4_;
    Logger::Logger((Logger *)local_1030,file,0x60);
    psVar1 = LogStream::operator<<
                       ((LogStream *)(local_1030 + 8),"TcpServer::removeConnectionInLoop [");
    psVar1 = LogStream::operator<<(psVar1,&this->m_name);
    psVar1 = LogStream::operator<<(psVar1,"] - connection ");
    psVar1 = LogStream::operator<<
                       (psVar1,&((conn->
                                 super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>
                                 )._M_ptr)->m_name);
    psVar1 = LogStream::operator<<(psVar1," - ");
    LogStream::operator<<
              (psVar1,((conn->
                       super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr)->m_id);
    Logger::~Logger((Logger *)local_1030);
  }
  local_1030._0_4_ =
       ((conn->super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
       m_id;
  sVar2 = std::
          _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::shared_ptr<sznet::net::TcpConnection>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::shared_ptr<sznet::net::TcpConnection>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<sznet::net::TcpConnection>_>_>_>
          ::erase(&(this->m_connections)._M_t,(key_type *)local_1030);
  if (sVar2 == 1) {
    this_00 = ((conn->super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr)->m_loop;
    local_50 = TcpConnection::connectDestroyed;
    local_48 = 0;
    std::_Bind<void(sznet::net::TcpConnection::*(std::shared_ptr<sznet::net::TcpConnection>))()>::
    _Bind<std::shared_ptr<sznet::net::TcpConnection>const&>
              ((_Bind<void(sznet::net::TcpConnection::*(std::shared_ptr<sznet::net::TcpConnection>))()>
                *)local_1030,(offset_in_TcpConnection_to_subr *)&local_50,conn);
    std::function<void()>::
    function<std::_Bind<void(sznet::net::TcpConnection::*(std::shared_ptr<sznet::net::TcpConnection>))()>,void>
              ((function<void()> *)&local_40,
               (_Bind<void_(sznet::net::TcpConnection::*(std::shared_ptr<sznet::net::TcpConnection>))()>
                *)local_1030);
    EventLoop::queueInLoop(this_00,&local_40);
    std::_Function_base::~_Function_base(&local_40.super__Function_base);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1030 + 0x18));
    return;
  }
  __assert_fail("n == 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/TcpServer.cpp"
                ,100,"void sznet::net::TcpServer::removeConnectionInLoop(const TcpConnectionPtr &)")
  ;
}

Assistant:

void TcpServer::removeConnectionInLoop(const TcpConnectionPtr& conn)
{
	m_loop->assertInLoopThread();
	LOG_INFO << "TcpServer::removeConnectionInLoop [" << m_name
		<< "] - connection " << conn->name() << " - " << conn->id();
	size_t n = m_connections.erase(conn->id());
	(void)n;
	assert(n == 1);
	EventLoop* ioLoop = conn->getLoop();
	ioLoop->queueInLoop(std::bind(&TcpConnection::connectDestroyed, conn));
}